

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void cmFortranModuleAppendUpperLower(string *mod,string *mod_upper,string *mod_lower)

{
  string *psVar1;
  bool bVar2;
  string_view str;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *ext;
  string *local_60;
  string *name;
  char *local_50;
  string_view local_48;
  string_view local_38;
  undefined8 local_28;
  size_type ext_len;
  string *mod_lower_local;
  string *mod_upper_local;
  string *mod_local;
  
  local_28 = 0;
  ext_len = (size_type)mod_lower;
  mod_lower_local = mod_upper;
  mod_upper_local = mod;
  local_38 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)mod);
  bVar2 = cmHasLiteralSuffix<5ul>(local_38,(char (*) [5])".mod");
  if (!bVar2) {
    local_48 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)mod_upper_local);
    bVar2 = cmHasLiteralSuffix<5ul>(local_48,(char (*) [5])".sub");
    if (!bVar2) {
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)mod_upper_local);
      local_50 = str._M_str;
      name = (string *)str._M_len;
      bVar2 = cmHasLiteralSuffix<6ul>(str,(char (*) [6])".smod");
      if (bVar2) {
        local_28 = 5;
      }
      goto LAB_0096cb52;
    }
  }
  local_28 = 4;
LAB_0096cb52:
  psVar1 = mod_upper_local;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&ext,(ulong)psVar1);
  psVar1 = mod_upper_local;
  local_60 = (string *)&ext;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)psVar1);
  local_88 = &local_a8;
  cmsys::SystemTools::UpperCase(&local_f8,local_60);
  std::operator+(&local_d8,&local_f8,local_88);
  std::__cxx11::string::operator+=((string *)mod_lower_local,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::operator+=((string *)ext_len,(string *)mod_upper_local);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

static void cmFortranModuleAppendUpperLower(std::string const& mod,
                                            std::string& mod_upper,
                                            std::string& mod_lower)
{
  std::string::size_type ext_len = 0;
  if (cmHasLiteralSuffix(mod, ".mod") || cmHasLiteralSuffix(mod, ".sub")) {
    ext_len = 4;
  } else if (cmHasLiteralSuffix(mod, ".smod")) {
    ext_len = 5;
  }
  std::string const& name = mod.substr(0, mod.size() - ext_len);
  std::string const& ext = mod.substr(mod.size() - ext_len);
  mod_upper += cmSystemTools::UpperCase(name) + ext;
  mod_lower += mod;
}